

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>::walkElementSegment
          (Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_> *this,ElementSegment *segment)

{
  pointer ppEVar1;
  Expression *in_RAX;
  pointer ppEVar2;
  Expression *local_38;
  Expression *expr;
  
  local_38 = in_RAX;
  if ((segment->table).super_IString.str._M_str != (char *)0x0) {
    walk(this,&segment->offset);
  }
  ppEVar2 = (segment->data).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (segment->data).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar1) {
    do {
      local_38 = *ppEVar2;
      walk(this,&local_38);
      ppEVar2 = ppEVar2 + 1;
    } while (ppEVar2 != ppEVar1);
  }
  if (segment->offset != (Expression *)0x0) {
    Module::getTable(this->currModule,(Name)(segment->table).super_IString.str);
  }
  return;
}

Assistant:

void walkElementSegment(ElementSegment* segment) {
    if (segment->table.is()) {
      walk(segment->offset);
    }
    for (auto* expr : segment->data) {
      walk(expr);
    }
    static_cast<SubType*>(this)->visitElementSegment(segment);
  }